

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b780::Binary_DecodeUvarInt_Test::TestBody(Binary_DecodeUvarInt_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  bool bVar1;
  Message *pMVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  char *message;
  Bytes *buf_00;
  Bytes *buf_01;
  Bytes *buf_02;
  Bytes *buf_03;
  char *in_R9;
  AssertHelper local_3a8;
  Message local_3a0;
  uint local_394;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_5;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_340;
  Message local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__3;
  tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310;
  uchar local_2da [10];
  iterator local_2d0;
  undefined8 local_2c8;
  AssertHelper local_2c0;
  Message local_2b8;
  uint local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_3;
  Message local_290;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_258;
  Message local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar__2;
  tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  initializer_list<unsigned_char> local_1f8;
  AssertHelper local_1e8;
  Message local_1e0;
  int local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__1;
  tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  AssertHelper local_138;
  Message local_130;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  string local_108;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  uchar local_6b [3];
  iterator local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  OptError optErr;
  undefined1 auStack_28 [4];
  UInt val;
  Bytes buf;
  Binary_DecodeUvarInt_Test *this_local;
  
  _auStack_28 = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  optErr.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._36_4_ = 0;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_58);
  local_6b[0] = '\x11';
  local_6b[1] = 0xff;
  local_6b[2] = 1;
  local_68 = local_6b;
  local_60 = 3;
  __l_00._M_len = 3;
  __l_00._M_array = local_68;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28,__l_00);
  binary::uvarint_abi_cxx11_(&local_b0,(binary *)auStack_28,buf_00);
  std::tie<unsigned_int,std::optional<std::__cxx11::string>>
            ((uint *)&gtest_ar_.message_,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&optErr.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0x24);
  std::tuple<unsigned_int&,std::optional<std::__cxx11::string>&>::operator=
            ((tuple<unsigned_int&,std::optional<std::__cxx11::string>&> *)&gtest_ar_.message_,
             &local_b0);
  std::
  tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~tuple(&local_b0);
  local_d1 = std::optional::operator_cast_to_bool((optional *)local_58);
  local_d1 = !local_d1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pMVar2 = testing::Message::operator<<(&local_e0,(char (*) [28])"Expected no error. error: \'");
    pbVar3 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_58);
    pMVar2 = testing::Message::operator<<(pMVar2,pbVar3);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [2])0x160304);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,(internal *)local_d0,(AssertionResult *)"optErr","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x3c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e8,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    testing::Message::~Message(&local_e0);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    local_124 = 0x11;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((EqHelper<false> *)local_120,"0x11","val",&local_124,
               (uint *)&optErr.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .field_0x24);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                 ,0x3d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message(&local_130);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
    binary::uvarint_abi_cxx11_(&local_168,(binary *)auStack_28,buf_01);
    std::tie<unsigned_int,std::optional<std::__cxx11::string>>
              ((uint *)&gtest_ar__1.message_,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&optErr.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0x24);
    std::tuple<unsigned_int&,std::optional<std::__cxx11::string>&>::operator=
              ((tuple<unsigned_int&,std::optional<std::__cxx11::string>&> *)&gtest_ar__1.message_,
               &local_168);
    std::
    tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~tuple(&local_168);
    local_189 = std::optional::operator_cast_to_bool((optional *)local_58);
    local_189 = !local_189;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_188,&local_189,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      pMVar2 = testing::Message::operator<<
                         (&local_198,(char (*) [28])"Expected no error. error: \'");
      pbVar3 = std::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_58);
      pMVar2 = testing::Message::operator<<(pMVar2,pbVar3);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [2])0x160304);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_188,(AssertionResult *)"optErr",
                 "true","false",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                 ,0x40,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1a0,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_198);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      local_1d4 = 0xff;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((EqHelper<false> *)local_1d0,"0xFF","val",&local_1d4,
                 (uint *)&optErr.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0x24);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1e0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                   ,0x41,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
        testing::internal::AssertHelper::~AssertHelper(&local_1e8);
        testing::Message::~Message(&local_1e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
      std::initializer_list<unsigned_char>::initializer_list(&local_1f8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28,local_1f8);
      binary::uvarint_abi_cxx11_(&local_228,(binary *)auStack_28,buf_02);
      std::tie<unsigned_int,std::optional<std::__cxx11::string>>
                ((uint *)&gtest_ar__2.message_,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&optErr.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0x24);
      std::tuple<unsigned_int&,std::optional<std::__cxx11::string>&>::operator=
                ((tuple<unsigned_int&,std::optional<std::__cxx11::string>&> *)&gtest_ar__2.message_,
                 &local_228);
      std::
      tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~tuple(&local_228);
      testing::AssertionResult::AssertionResult<std::optional<std::__cxx11::string>>
                ((AssertionResult *)local_248,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_58,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar1) {
        testing::Message::Message(&local_250);
        pMVar2 = testing::Message::operator<<
                           (&local_250,(char (*) [31])"Expected an error. expected: \'");
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)multihash::errVarIntBufferTooShort_abi_cxx11_);
        pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [2])0x160304);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_248,(AssertionResult *)"optErr",
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_258,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                   ,0x46,pcVar4);
        testing::internal::AssertHelper::operator=(&local_258,pMVar2);
        testing::internal::AssertHelper::~AssertHelper(&local_258);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_250);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        pbVar3 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_58);
        testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                  ((EqHelper<false> *)local_288,"multihash::errVarIntBufferTooShort",
                   "optErr.value()",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   multihash::errVarIntBufferTooShort_abi_cxx11_,pbVar3);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
        if (!bVar1) {
          testing::Message::Message(&local_290);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                     ,0x47,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_290);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_290);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          local_2ac = 0;
          pcVar4 = (char *)0x0;
          testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                    (local_2a8,"0",(int *)"val",&local_2ac,
                     &optErr.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0x24);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
          if (!bVar1) {
            testing::Message::Message(&local_2b8);
            message = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2c0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                       ,0x48,message);
            testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
            testing::internal::AssertHelper::~AssertHelper(&local_2c0);
            testing::Message::~Message(&local_2b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
          local_2da[0] = 0x80;
          local_2da[1] = 0x80;
          local_2da[2] = 0x80;
          local_2da[3] = 0x80;
          local_2da[4] = 0x80;
          local_2da[5] = 0x80;
          local_2da[6] = 0x80;
          local_2da[7] = 0x80;
          local_2da[8] = 0x80;
          local_2da[9] = 2;
          local_2d0 = local_2da;
          local_2c8 = 10;
          __l._M_len = 10;
          __l._M_array = local_2d0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28,__l);
          binary::uvarint_abi_cxx11_(&local_310,(binary *)auStack_28,buf_03);
          std::tie<unsigned_int,std::optional<std::__cxx11::string>>
                    ((uint *)&gtest_ar__3.message_,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&optErr.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0x24);
          std::tuple<unsigned_int&,std::optional<std::__cxx11::string>&>::operator=
                    ((tuple<unsigned_int&,std::optional<std::__cxx11::string>&> *)
                     &gtest_ar__3.message_,&local_310);
          std::
          tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~tuple(&local_310);
          testing::AssertionResult::AssertionResult<std::optional<std::__cxx11::string>>
                    ((AssertionResult *)local_330,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_58,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
          if (!bVar1) {
            testing::Message::Message(&local_338);
            pMVar2 = testing::Message::operator<<
                               (&local_338,(char (*) [31])"Expected an error. expected: \'");
            pMVar2 = testing::Message::operator<<
                               (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)multihash::errVarIntTooLong_abi_cxx11_);
            pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [2])0x160304);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_4.message_,(internal *)local_330,
                       (AssertionResult *)"optErr","false","true",pcVar4);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_340,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                       ,0x4d,pcVar4);
            testing::internal::AssertHelper::operator=(&local_340,pMVar2);
            testing::internal::AssertHelper::~AssertHelper(&local_340);
            std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_338);
          }
          gtest_ar.message_.ptr_._5_3_ = 0;
          gtest_ar.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
          if (gtest_ar.message_.ptr_._4_4_ == 0) {
            pbVar3 = std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_58);
            testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                      ((EqHelper<false> *)local_370,"multihash::errVarIntTooLong","optErr.value()",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       multihash::errVarIntTooLong_abi_cxx11_,pbVar3);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
            if (!bVar1) {
              testing::Message::Message(&local_378);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                         ,0x4e,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_5.message_,&local_378);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
              testing::Message::~Message(&local_378);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              local_394 = 0;
              testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                        (local_390,"0",(int *)"val",&local_394,
                         &optErr.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0x24);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
              if (!bVar1) {
                testing::Message::Message(&local_3a0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
                testing::internal::AssertHelper::AssertHelper
                          (&local_3a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                           ,0x4f,pcVar4);
                testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
                testing::internal::AssertHelper::~AssertHelper(&local_3a8);
                testing::Message::~Message(&local_3a0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
              gtest_ar.message_.ptr_._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  return;
}

Assistant:

TEST(Binary, DecodeUvarInt) {
	multihash::Bytes buf{};
	multihash::UInt val{};
	multihash::OptError optErr{};

	// read values
	buf = {0x11, 0xFF, 0x01};
	std::tie(val, optErr) = binary::uvarint(buf); // first value
	ASSERT_FALSE(optErr) << "Expected no error. error: '" << optErr.value() << "'";
	EXPECT_EQ(0x11, val);

	std::tie(val, optErr) = binary::uvarint(buf); // second value
	ASSERT_FALSE(optErr) << "Expected no error. error: '" << optErr.value() << "'";
	EXPECT_EQ(0xFF, val);

	// empty buffer
	buf = {};
	std::tie(val, optErr) = binary::uvarint(buf);
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errVarIntBufferTooShort << "'";
	ASSERT_EQ(multihash::errVarIntBufferTooShort, optErr.value());
	EXPECT_EQ(0, val);

	// value overflow
	buf = {0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x02};
	std::tie(val, optErr) = binary::uvarint(buf);
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errVarIntTooLong << "'";
	ASSERT_EQ(multihash::errVarIntTooLong, optErr.value());
	EXPECT_EQ(0, val);
}